

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void launch_workers(MultiThreadInfo *mt_info,int num_workers)

{
  AVxWorker *pAVar1;
  AVxWorkerInterface *pAVar2;
  long lVar3;
  
  pAVar2 = aom_get_worker_interface();
  lVar3 = (ulong)(uint)num_workers * 0x38;
  for (; 0 < num_workers; num_workers = num_workers + -1) {
    pAVar1 = mt_info->workers;
    *(undefined4 *)((long)&pAVar1[-1].had_error + lVar3) = 0;
    (*(&pAVar2->launch)[lVar3 + -0x38 == 0])((AVxWorker *)((long)&pAVar1[-1].impl_ + lVar3));
    lVar3 = lVar3 + -0x38;
  }
  return;
}

Assistant:

static inline void launch_workers(MultiThreadInfo *const mt_info,
                                  int num_workers) {
  const AVxWorkerInterface *const winterface = aom_get_worker_interface();
  for (int i = num_workers - 1; i >= 0; i--) {
    AVxWorker *const worker = &mt_info->workers[i];
    worker->had_error = 0;
    if (i == 0)
      winterface->execute(worker);
    else
      winterface->launch(worker);
  }
}